

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O1

void fiobj_data_dealloc(FIOBJ o,_func_void_FIOBJ_void_ptr *task,void *arg)

{
  int __fd;
  
  __fd = *(int *)(o + 0x30);
  if (__fd == -2) {
    fiobj_free(*(FIOBJ *)(o + 0x10));
  }
  else if (__fd == -1) {
    if ((*(code **)(o + 0x10) != (code *)0x0) && (*(long *)(o + 8) != 0)) {
      (**(code **)(o + 0x10))();
    }
  }
  else {
    close(__fd);
    fio_free(*(void **)(o + 8));
  }
  fio_free((void *)o);
  return;
}

Assistant:

static void fiobj_data_dealloc(FIOBJ o, void (*task)(FIOBJ, void *),
                               void *arg) {
  switch (obj2io(o)->fd) {
  case -1:
    if (obj2io(o)->source.dealloc && obj2io(o)->buffer)
      obj2io(o)->source.dealloc(obj2io(o)->buffer);
    break;
  case -2:
    fiobj_free(obj2io(o)->source.parent);
    break;
  default:
    close(obj2io(o)->fd);
    fio_free(obj2io(o)->buffer);
    break;
  }
  fio_free((void *)o);
  (void)task;
  (void)arg;
}